

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall
QWidgetRepaintManager::markDirty<QRect>
          (QWidgetRepaintManager *this,QRect *r,QWidget *widget,UpdateTime updateTime,
          BufferState bufferState)

{
  QWidgetRepaintManager QVar1;
  uint uVar2;
  undefined8 uVar3;
  QWidgetPrivate *this_00;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  char cVar11;
  byte bVar12;
  QLoggingCategory *pQVar13;
  QDebug *pQVar14;
  QSize QVar15;
  long in_FS_OFFSET;
  QRect local_c0;
  QRect local_b0;
  QRect local_a0;
  QPoint local_90;
  QRect local_88;
  QRect local_78;
  undefined4 uStack_68;
  undefined4 local_64;
  char *local_60;
  undefined1 local_58 [8];
  QDebug local_50;
  QDebug local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar13->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_60 = pQVar13->name;
    local_78.x1.m_i = 2;
    local_78.y1.m_i = 0;
    local_78.x2.m_i = 0;
    local_78.y2.m_i = 0;
    uStack_68 = 0;
    local_64 = 0;
    QMessageLogger::info();
    pQVar14 = QDebug::operator<<((QDebug *)&local_b0,"Marking");
    local_58 = (undefined1  [8])pQVar14->stream;
    *(int *)((long)local_58 + 0x28) = *(int *)((long)local_58 + 0x28) + 1;
    ::operator<<((Stream *)&local_a0,(QRect *)local_58);
    pQVar14 = QDebug::operator<<((QDebug *)&local_a0,"of");
    local_50.stream = pQVar14->stream;
    *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_88,(QWidget *)&local_50);
    pQVar14 = QDebug::operator<<((QDebug *)&local_88,"dirty");
    pQVar14 = QDebug::operator<<(pQVar14,"with");
    local_48.stream = pQVar14->stream;
    *(int *)(local_48.stream + 0x28) = *(int *)(local_48.stream + 0x28) + 1;
    ::operator<<((Stream *)local_40,(UpdateTime)&local_48);
    QDebug::~QDebug((QDebug *)local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug((QDebug *)&local_88);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug((QDebug *)&local_a0);
    QDebug::~QDebug((QDebug *)local_58);
    QDebug::~QDebug((QDebug *)&local_b0);
  }
  QWidgetPrivate::invalidateGraphicsEffectsRecursively(*(QWidgetPrivate **)&widget->field_0x8);
  uVar4 = r->x1;
  uVar5 = r->y1;
  uVar6 = r->x2;
  uVar7 = r->y2;
  local_78.x1.m_i = uVar4;
  local_78.y1.m_i = uVar5;
  local_78.x2.m_i = uVar6;
  local_78.y2.m_i = uVar7;
  bVar10 = QWidgetPrivate::shouldPaintOnScreen(*(QWidgetPrivate **)&widget->field_0x8);
  if (bVar10) {
    cVar11 = QRegion::isEmpty();
    if (cVar11 == '\0') {
      cVar11 = qt_region_strictContains((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_78);
      if (cVar11 == '\0') {
        cVar11 = QRegion::isEmpty();
        QRegion::operator+=((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),r);
        if ((updateTime != UpdateNow) && (cVar11 == '\0')) goto LAB_00310aea;
      }
      else {
        if (updateTime != UpdateNow) goto LAB_00310aea;
        updateTime = UpdateNow;
      }
    }
    else {
      QRegion::QRegion((QRegion *)&local_88,r,Rectangle);
      uVar3 = *(undefined8 *)(*(long *)&widget->field_0x8 + 0xe0);
      *(undefined8 *)(*(long *)&widget->field_0x8 + 0xe0) = local_88._0_8_;
      local_88._0_8_ = uVar3;
      QRegion::~QRegion((QRegion *)&local_88);
    }
  }
  else {
    uVar2 = *(uint *)&(*(QWidgetPrivate **)&widget->field_0x8)->field_0x250;
    if ((uVar2 >> 0x18 & 1) == 0) {
      local_88 = QWidgetPrivate::effectiveRectFor(*(QWidgetPrivate **)&widget->field_0x8,&local_78);
      auVar8._8_8_ = 0;
      auVar8._0_4_ = local_a0.x2.m_i;
      auVar8._4_4_ = local_a0.y2.m_i;
      local_a0 = (QRect)(auVar8 << 0x40);
      local_90 = QWidget::mapTo(widget,*(QWidget **)this,(QPoint *)&local_a0);
      local_a0 = QRect::translated(&local_88,&local_90);
      QVar15 = QWidget::size(*(QWidget **)this);
      auVar9._4_4_ = QVar15.ht.m_i.m_i + -1;
      auVar9._0_4_ = QVar15.wd.m_i.m_i + -1;
      auVar9._8_8_ = 0;
      local_b0 = (QRect)(auVar9 << 0x40);
      local_a0 = (QRect)QRect::operator&(&local_a0,&local_b0);
      cVar11 = qt_region_strictContains((QRegion *)(this + 0x10),&local_a0);
      if (cVar11 == '\0') {
        if (bufferState == BufferInvalid) {
          bVar12 = QRegion::isEmpty();
          QVar1 = this[0x88];
          if ((*(QWidgetPrivate **)&widget->field_0x8)->graphicsEffect != (QGraphicsEffect *)0x0) {
            local_c0 = QWidgetPrivate::effectiveRectFor(*(QWidgetPrivate **)&widget->field_0x8,r);
            r = &local_c0;
          }
          local_b0 = QRect::translated(r,&local_90);
          QRegion::operator+=((QRegion *)(this + 0x10),&local_b0);
          if (updateTime != UpdateNow && (((byte)QVar1 ^ 1) & bVar12) == 0) goto LAB_00310aea;
        }
        else {
          if (*(long *)(this + 0x28) != 0) {
            if ((*(byte *)(*(long *)&widget->field_0x8 + 0x252) & 8) == 0) {
              QRegion::QRegion((QRegion *)&local_b0,r,Rectangle);
              addDirtyWidget(this,widget,(QRegion *)&local_b0);
              QRegion::~QRegion((QRegion *)&local_b0);
            }
            else {
              cVar11 = qt_region_strictContains
                                 ((QRegion *)(*(long *)&widget->field_0x8 + 0xe0),&local_88);
              if (cVar11 == '\0') {
                this_00 = *(QWidgetPrivate **)&widget->field_0x8;
                if (this_00->graphicsEffect != (QGraphicsEffect *)0x0) {
                  local_b0 = QWidgetPrivate::effectiveRectFor(this_00,r);
                  r = &local_b0;
                  this_00 = *(QWidgetPrivate **)&widget->field_0x8;
                }
                QRegion::operator+=(&this_00->dirty,r);
              }
            }
            goto LAB_00310943;
          }
          QRegion::QRegion((QRegion *)&local_b0,r,Rectangle);
          addDirtyWidget(this,widget,(QRegion *)&local_b0);
          QRegion::~QRegion((QRegion *)&local_b0);
        }
      }
      else {
LAB_00310943:
        if (updateTime != UpdateNow) goto LAB_00310aea;
        updateTime = UpdateNow;
      }
      widget = *(QWidget **)this;
    }
    else {
      if ((uVar2 >> 0x13 & 1) == 0) {
        addDirtyRenderToTextureWidget(this,widget);
      }
      if ((updateTime != UpdateNow) && (this[0x88] != (QWidgetRepaintManager)0x0))
      goto LAB_00310aea;
      widget = *(QWidget **)this;
    }
  }
  sendUpdateRequest(this,widget,updateTime);
LAB_00310aea:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::markDirty(const T &r, QWidget *widget, UpdateTime updateTime, BufferState bufferState)
{
    qCInfo(lcWidgetPainting) << "Marking" << r << "of" << widget << "dirty"
        << "with" << updateTime;

    Q_ASSERT(tlw->d_func()->extra);
    Q_ASSERT(tlw->d_func()->extra->topextra);
    Q_ASSERT(widget->isVisible() && widget->updatesEnabled());
    Q_ASSERT(widget->window() == tlw);
    Q_ASSERT(!r.isEmpty());

#if QT_CONFIG(graphicseffect)
    widget->d_func()->invalidateGraphicsEffectsRecursively();
#endif

    QRect widgetRect = widgetRectFor(widget, r);

    // ---------------------------------------------------------------------------

    if (widget->d_func()->shouldPaintOnScreen()) {
        if (widget->d_func()->dirty.isEmpty()) {
            widget->d_func()->dirty = r;
            sendUpdateRequest(widget, updateTime);
            return;
        } else if (qt_region_strictContains(widget->d_func()->dirty, widgetRect)) {
            if (updateTime == UpdateNow)
                sendUpdateRequest(widget, updateTime);
            return; // Already dirty
        }

        const bool eventAlreadyPosted = !widget->d_func()->dirty.isEmpty();
        widget->d_func()->dirty += r;
        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(widget, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (QWidgetPrivate::get(widget)->renderToTexture) {
        if (!widget->d_func()->inDirtyList)
            addDirtyRenderToTextureWidget(widget);
        if (!updateRequestSent || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    QRect effectiveWidgetRect = widget->d_func()->effectiveRectFor(widgetRect);
    const QPoint offset = widget->mapTo(tlw, QPoint());
    QRect translatedRect = effectiveWidgetRect.translated(offset);
#if QT_CONFIG(graphicseffect)
    // Graphics effects may exceed window size, clamp
    translatedRect = translatedRect.intersected(QRect(QPoint(), tlw->size()));
#endif
    if (qt_region_strictContains(dirty, translatedRect)) {
        if (updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return; // Already dirty
    }

    // ---------------------------------------------------------------------------

    if (bufferState == BufferInvalid) {
        const bool eventAlreadyPosted = !dirty.isEmpty() || updateRequestSent;
#if QT_CONFIG(graphicseffect)
        if (widget->d_func()->graphicsEffect)
            dirty += widget->d_func()->effectiveRectFor(r).translated(offset);
        else
#endif
            dirty += r.translated(offset);

        if (!eventAlreadyPosted || updateTime == UpdateNow)
            sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (dirtyWidgets.isEmpty()) {
        addDirtyWidget(widget, r);
        sendUpdateRequest(tlw, updateTime);
        return;
    }

    // ---------------------------------------------------------------------------

    if (widget->d_func()->inDirtyList) {
        if (!qt_region_strictContains(widget->d_func()->dirty, effectiveWidgetRect)) {
#if QT_CONFIG(graphicseffect)
            if (widget->d_func()->graphicsEffect)
                widget->d_func()->dirty += widget->d_func()->effectiveRectFor(r);
            else
#endif
                widget->d_func()->dirty += r;
        }
    } else {
        addDirtyWidget(widget, r);
    }

    // ---------------------------------------------------------------------------

    if (updateTime == UpdateNow)
        sendUpdateRequest(tlw, updateTime);
}